

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_write.cpp
# Opt level: O0

string * FormatScript_abi_cxx11_(CScript *script)

{
  const_iterator __last;
  const_iterator __last_00;
  const_iterator __last_01;
  const_iterator __last_02;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  bool bVar1;
  size_type sVar2;
  string *in_RDI;
  long in_FS_OFFSET;
  opcodetype in_stack_0000000c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vch;
  const_iterator it2;
  opcodetype op;
  const_iterator it;
  string str;
  string ret;
  undefined4 in_stack_fffffffffffffc48;
  size_type in_stack_fffffffffffffc4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  const_iterator in_stack_fffffffffffffc58;
  const_iterator in_stack_fffffffffffffc60;
  opcodetype *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  const_iterator in_stack_fffffffffffffc78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  const_iterator in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  byte in_stack_fffffffffffffc97;
  const_iterator in_stack_fffffffffffffc98;
  const_iterator in_stack_fffffffffffffcd0;
  const_iterator in_stack_fffffffffffffcd8;
  int local_314;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e1;
  undefined1 local_2a9 [9];
  uchar *local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_231;
  undefined1 local_1fd [41];
  int local_1d4;
  uchar *local_1d0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc60.ptr);
  local_1d0 = (uchar *)prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                                 ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                                  in_stack_fffffffffffffc50);
  do {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffc50);
    bVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator!=
                      ((const_iterator *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc58);
    if (!bVar1) break;
    local_1fd._29_8_ = local_1d0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    bVar1 = CScript::GetOp((CScript *)in_stack_fffffffffffffc78.ptr,
                           (const_iterator *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffc60.ptr);
    if (bVar1) {
      if (local_1d4 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc58.ptr,(char *)in_stack_fffffffffffffc50);
        local_314 = 2;
      }
      else if (((local_1d4 < 0x51) || (0x60 < local_1d4)) && (local_1d4 != 0x4f)) {
        if ((0x60 < local_1d4) && (local_1d4 < 0xba)) {
          GetOpName_abi_cxx11_(in_stack_0000000c);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68,
                     (size_type)in_stack_fffffffffffffc60.ptr);
          in_stack_fffffffffffffc98.ptr = local_1fd;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc98.ptr,
                     (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
                     (allocator<char> *)in_stack_fffffffffffffc88.ptr);
          in_stack_fffffffffffffc97 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffc78.ptr,in_stack_fffffffffffffc70);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          std::allocator<char>::~allocator((allocator<char> *)local_1fd);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          if ((in_stack_fffffffffffffc97 & 1) == 0) {
            local_314 = 0;
          }
          else {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68,
                       (size_type)in_stack_fffffffffffffc60.ptr);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffc60.ptr,(char *)in_stack_fffffffffffffc58.ptr);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc58.ptr,in_stack_fffffffffffffc50);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
            local_314 = 2;
          }
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          if (local_314 != 0) goto LAB_00dbc34b;
        }
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        if (sVar2 == 0) {
          local_2a0 = (uchar *)local_1fd._29_8_;
          local_2a9._1_8_ = local_1d0;
          in_stack_fffffffffffffc68 = (opcodetype *)local_2a9;
          std::allocator<unsigned_char>::allocator
                    ((allocator<unsigned_char> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          __last_01.ptr._7_1_ = in_stack_fffffffffffffc97;
          __last_01.ptr._0_7_ = in_stack_fffffffffffffc90;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc78.ptr,in_stack_fffffffffffffc98,__last_01,
                     (allocator_type *)in_stack_fffffffffffffc70);
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffffc58.ptr,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc50,
                     (type)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          s_01.m_size = (size_t)in_stack_fffffffffffffcd8.ptr;
          s_01.m_data = in_stack_fffffffffffffcd0.ptr;
          HexStr_abi_cxx11_(s_01);
          tinyformat::format<std::__cxx11::string>
                    ((char *)in_stack_fffffffffffffc78.ptr,in_stack_fffffffffffffc70);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc58.ptr,in_stack_fffffffffffffc50);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc58.ptr);
          std::allocator<unsigned_char>::~allocator
                    ((allocator<unsigned_char> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        }
        else {
          local_231._1_8_ = local_1fd._29_8_;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          in_stack_fffffffffffffc88 =
               prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator-
                         ((const_iterator *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          args = &local_231;
          std::allocator<unsigned_char>::allocator
                    ((allocator<unsigned_char> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          __last.ptr._7_1_ = in_stack_fffffffffffffc97;
          __last.ptr._0_7_ = in_stack_fffffffffffffc90;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc78.ptr,in_stack_fffffffffffffc98,__last,
                     (allocator_type *)in_stack_fffffffffffffc70);
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffffc58.ptr,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc50,
                     (type)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          s.m_size = (size_t)in_stack_fffffffffffffcd8.ptr;
          s.m_data = in_stack_fffffffffffffcd0.ptr;
          HexStr_abi_cxx11_(s);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          in_stack_fffffffffffffc78 =
               prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator-
                         ((const_iterator *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
          local_269._1_8_ = local_1d0;
          in_stack_fffffffffffffc70 = &local_269;
          in_stack_fffffffffffffcd8 = in_stack_fffffffffffffc78;
          std::allocator<unsigned_char>::allocator
                    ((allocator<unsigned_char> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          __last_00.ptr._7_1_ = in_stack_fffffffffffffc97;
          __last_00.ptr._0_7_ = in_stack_fffffffffffffc90;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc78.ptr,in_stack_fffffffffffffc98,__last_00,
                     (allocator_type *)in_stack_fffffffffffffc70);
          Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((Span<const_unsigned_char> *)in_stack_fffffffffffffc58.ptr,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc50,
                     (type)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          s_00.m_size = (size_t)in_stack_fffffffffffffcd8.ptr;
          s_00.m_data = in_stack_fffffffffffffcd0.ptr;
          HexStr_abi_cxx11_(s_00);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    ((char *)in_stack_fffffffffffffc88.ptr,args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc78.ptr);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc58.ptr,in_stack_fffffffffffffc50);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc58.ptr);
          std::allocator<unsigned_char>::~allocator
                    ((allocator<unsigned_char> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffc58.ptr);
          std::allocator<unsigned_char>::~allocator
                    ((allocator<unsigned_char> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        }
        local_314 = 2;
      }
      else {
        local_1fd._1_4_ = local_1d4 + -0x50;
        tinyformat::format<int>
                  ((char *)in_stack_fffffffffffffc78.ptr,(int *)in_stack_fffffffffffffc70);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc58.ptr,in_stack_fffffffffffffc50);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        local_314 = 2;
      }
    }
    else {
      local_2e1._1_8_ = local_1fd._29_8_;
      in_stack_fffffffffffffc60 =
           prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                     ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffffc50)
      ;
      in_stack_fffffffffffffc58.ptr = (uchar *)&local_2e1;
      in_stack_fffffffffffffcd0 = in_stack_fffffffffffffc60;
      std::allocator<unsigned_char>::allocator
                ((allocator<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      __last_02.ptr._7_1_ = in_stack_fffffffffffffc97;
      __last_02.ptr._0_7_ = in_stack_fffffffffffffc90;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffc78.ptr,in_stack_fffffffffffffc98,__last_02,
                 (allocator_type *)in_stack_fffffffffffffc70);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffc58.ptr,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc50,
                 (type)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      s_02.m_size = (size_t)in_stack_fffffffffffffcd8.ptr;
      s_02.m_data = in_stack_fffffffffffffcd0.ptr;
      HexStr_abi_cxx11_(s_02);
      tinyformat::format<std::__cxx11::string>
                ((char *)in_stack_fffffffffffffc78.ptr,in_stack_fffffffffffffc70);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc58.ptr,in_stack_fffffffffffffc50);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffc58.ptr);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      local_314 = 3;
    }
LAB_00dbc34b:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffc58.ptr);
  } while (local_314 == 2);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  if (!bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffc70,(size_type)in_stack_fffffffffffffc68,
             (size_type)in_stack_fffffffffffffc60.ptr);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string FormatScript(const CScript& script)
{
    std::string ret;
    CScript::const_iterator it = script.begin();
    opcodetype op;
    while (it != script.end()) {
        CScript::const_iterator it2 = it;
        std::vector<unsigned char> vch;
        if (script.GetOp(it, op, vch)) {
            if (op == OP_0) {
                ret += "0 ";
                continue;
            } else if ((op >= OP_1 && op <= OP_16) || op == OP_1NEGATE) {
                ret += strprintf("%i ", op - OP_1NEGATE - 1);
                continue;
            } else if (op >= OP_NOP && op <= OP_NOP10) {
                std::string str(GetOpName(op));
                if (str.substr(0, 3) == std::string("OP_")) {
                    ret += str.substr(3, std::string::npos) + " ";
                    continue;
                }
            }
            if (vch.size() > 0) {
                ret += strprintf("0x%x 0x%x ", HexStr(std::vector<uint8_t>(it2, it - vch.size())),
                                               HexStr(std::vector<uint8_t>(it - vch.size(), it)));
            } else {
                ret += strprintf("0x%x ", HexStr(std::vector<uint8_t>(it2, it)));
            }
            continue;
        }
        ret += strprintf("0x%x ", HexStr(std::vector<uint8_t>(it2, script.end())));
        break;
    }
    return ret.substr(0, ret.empty() ? ret.npos : ret.size() - 1);
}